

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

int xcb_input_feedback_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_state_data_t *_aux)

{
  void *__dest;
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [27];
  uint local_1f0;
  undefined2 local_1ec;
  undefined1 local_1ea;
  xcb_input_feedback_state_data_t *local_1e8;
  ulong local_1e0;
  uint16_t *local_1d8 [2];
  uint32_t *local_1c8;
  long local_1c0;
  uint32_t *local_1b8 [2];
  uint8_t *local_1a8;
  undefined8 local_1a0;
  uint8_t *local_198;
  undefined8 local_190;
  uint8_t *local_188;
  undefined8 local_180;
  uint *local_178;
  undefined8 local_170;
  uint8_t *local_168;
  undefined8 local_160;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_1f0 = 0;
  local_1ea = 0;
  local_1ec = 0;
  memset(&local_1e8,0xaa,0x1b0);
  uVar5 = 0;
  uVar1 = 0;
  bVar7 = (int)CONCAT71(in_register_00000031,class_id) == 0;
  if (bVar7) {
    local_1e8 = _aux;
    local_1e0 = 2;
    local_1d8[0] = &(_aux->keyboard).duration;
    local_1d8[1] = (uint16_t *)0x2;
    local_1c8 = &(_aux->keyboard).led_mask;
    local_1c0 = 4;
    local_1b8[0] = &(_aux->keyboard).led_values;
    local_1b8[1] = (uint32_t *)0x4;
    local_1a8 = &(_aux->keyboard).global_auto_repeat;
    local_1a0 = 1;
    local_198 = &(_aux->keyboard).click;
    local_190 = 1;
    local_188 = &(_aux->keyboard).percent;
    local_180 = 1;
    local_178 = &local_1f0;
    local_170 = 1;
    local_168 = (_aux->keyboard).auto_repeats;
    local_160 = 0x20;
    uVar1 = 0x30;
    uVar5 = 9;
  }
  uVar4 = (uint)bVar7;
  if (class_id == '\x01') {
    uVar6 = (ulong)(uVar5 << 4);
    *(undefined2 **)((long)&local_1e8 + uVar6) = &local_1ec;
    *(undefined8 *)((long)&local_1e0 + uVar6) = 2;
    *(uint16_t **)((long)local_1d8 + uVar6) = &(_aux->pointer).accel_num;
    *(undefined8 *)((long)local_1d8 + uVar6 + 8) = 2;
    *(uint16_t **)((long)&local_1e8 + (uVar6 | 0x20)) = &(_aux->pointer).accel_denom;
    *(undefined8 *)((long)&local_1c0 + uVar6) = 2;
    *(uint16_t **)((long)local_1b8 + uVar6) = &(_aux->pointer).threshold;
    uVar1 = uVar1 | 8;
    *(undefined8 *)((long)local_1b8 + uVar6 + 8) = 2;
    uVar5 = uVar5 | 4;
    uVar4 = 2;
  }
  iVar2 = 0;
  if (class_id == '\x02') {
    uVar6 = (ulong)(uVar5 << 4);
    *(anon_struct_16_3_1f041e3f_for_string **)((long)&local_1e8 + uVar6) = &_aux->string;
    *(undefined8 *)((long)&local_1e0 + uVar6) = 2;
    *(uint16_t **)((long)local_1d8 + uVar6) = &(_aux->string).num_keysyms;
    iVar2 = uVar1 + 4;
    *(undefined8 *)((long)local_1d8 + uVar6 + 8) = 2;
    *(xcb_keysym_t **)((long)&local_1c8 + uVar6) = (_aux->string).keysyms;
    lVar3 = (ulong)(_aux->string).num_keysyms << 2;
    uVar1 = (uint)lVar3;
    *(long *)((long)&local_1c0 + uVar6) = lVar3;
    uVar5 = uVar5 + 3;
    uVar4 = 4;
  }
  if (class_id == '\x03') {
    uVar6 = (ulong)(uVar5 << 4);
    *(anon_struct_12_3_70475da0_for_integer **)((long)&local_1e8 + uVar6) = &_aux->integer;
    *(undefined8 *)((long)&local_1e0 + uVar6) = 4;
    *(int32_t **)((long)local_1d8 + uVar6) = &(_aux->integer).min_value;
    *(undefined8 *)((long)local_1d8 + uVar6 + 8) = 4;
    *(int32_t **)((long)&local_1c8 + uVar6) = &(_aux->integer).max_value;
    uVar1 = uVar1 + 0xc;
    *(undefined8 *)((long)&local_1c0 + uVar6) = 4;
    uVar5 = uVar5 + 3;
    uVar4 = 4;
  }
  if (class_id == '\x04') {
    uVar6 = (ulong)(uVar5 << 4);
    *(anon_struct_8_2_3f0cf693_for_led **)((long)&local_1e8 + uVar6) = &_aux->led;
    *(undefined8 *)((long)&local_1e0 + uVar6) = 4;
    *(uint32_t **)((long)local_1d8 + uVar6) = &(_aux->led).led_values;
    uVar1 = uVar1 + 8;
    *(undefined8 *)((long)local_1d8 + uVar6 + 8) = 4;
    uVar5 = uVar5 + 2;
    uVar4 = 4;
  }
  if (class_id == '\x05') {
    uVar6 = (ulong)(uVar5 << 4);
    *(anon_struct_8_4_64ea3a00_for_bell **)((long)&local_1e8 + uVar6) = &_aux->bell;
    *(undefined8 *)((long)&local_1e0 + uVar6) = 1;
    *(undefined2 **)((long)local_1d8 + uVar6) = &local_1ec;
    *(undefined8 *)((long)local_1d8 + uVar6 + 8) = 3;
    *(uint16_t **)((long)&local_1c8 + uVar6) = &(_aux->bell).pitch;
    *(undefined8 *)((long)&local_1c0 + uVar6) = 2;
    *(uint16_t **)((long)local_1b8 + uVar6) = &(_aux->bell).duration;
    uVar1 = uVar1 + 8;
    *(undefined8 *)((long)local_1b8 + uVar6 + 8) = 2;
    uVar5 = uVar5 + 4;
    uVar4 = 2;
  }
  uVar4 = uVar4 - 1 & -uVar1;
  local_1f0 = uVar4;
  if (uVar4 != 0) {
    *(undefined2 **)((long)&local_1e8 + (ulong)(uVar5 << 4)) = &local_1ec;
    *(ulong *)((long)&local_1e0 + (ulong)(uVar5 << 4)) = (ulong)uVar4;
    uVar5 = uVar5 + 1;
    local_1f0 = 0;
  }
  uVar4 = iVar2 + uVar1 + uVar4;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar4);
    *_buffer = __dest;
  }
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      if ((*(void **)((long)&local_1e8 + uVar6) != (void *)0x0) &&
         (*(size_t *)((long)&local_1e0 + uVar6) != 0)) {
        memcpy(__dest,*(void **)((long)&local_1e8 + uVar6),*(size_t *)((long)&local_1e0 + uVar6));
      }
      __dest = (void *)((long)__dest + *(long *)((long)&local_1e0 + uVar6));
      uVar6 = uVar6 + 0x10;
    } while (uVar5 << 4 != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar4;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_feedback_state_data_serialize (void                                  **_buffer,
                                         uint8_t                                 class_id,
                                         const xcb_input_feedback_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[27];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_state_data_t.keyboard.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.global_auto_repeat */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.global_auto_repeat;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.click */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.click;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.auto_repeats */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->keyboard.auto_repeats;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_state_data_t.pointer.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_num;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_denom;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_state_data_t.string.max_symbols */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.max_symbols;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_state_data_t.integer.resolution */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.resolution;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.integer.min_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.min_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
        /* xcb_input_feedback_state_data_t.integer.max_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.max_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_state_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_state_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}